

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O2

ZyanStatus
ZyanVectorFindEx(ZyanVector *vector,void *element,ZyanISize *found_index,
                ZyanEqualityComparison comparison,ZyanUSize index,ZyanUSize count)

{
  ulong uVar1;
  ZyanBool ZVar2;
  ZyanUSize i;
  ulong uVar3;
  ZyanStatus local_3c;
  
  if (vector == (ZyanVector *)0x0) {
    local_3c = 0x80100004;
  }
  else {
    uVar1 = count + index;
    local_3c = 0x80100008;
    if (vector->size != index && uVar1 <= vector->size) {
      local_3c = 0x100003;
      uVar3 = 0xffffffffffffffff;
      if (count != 0) {
        if (vector->element_size == 0) {
          __assert_fail("vector->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x29f,
                        "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        if (vector->data == (void *)0x0) {
          __assert_fail("vector->data",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x2a0,
                        "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                       );
        }
        for (; index < uVar1; index = index + 1) {
          ZVar2 = (*comparison)((void *)(vector->element_size * index + (long)vector->data),element)
          ;
          if (ZVar2 != '\0') {
            local_3c = 0x100002;
            uVar3 = index;
            break;
          }
        }
      }
      *found_index = uVar3;
    }
  }
  return local_3c;
}

Assistant:

ZyanStatus ZyanVectorFindEx(const ZyanVector* vector, const void* element, ZyanISize* found_index,
    ZyanEqualityComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index + count > vector->size) || (index == vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = -1;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    for (ZyanUSize i = index; i < index + count; ++i)
    {
        if (comparison(ZYCORE_VECTOR_OFFSET(vector, i), element))
        {
            *found_index = i;
            return ZYAN_STATUS_TRUE;
        }
    }

    *found_index = -1;
    return ZYAN_STATUS_FALSE;
}